

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

object * __thiscall
pybind11::detail::accessor<pybind11::detail::accessor_policies::list_item>::get_cache
          (accessor<pybind11::detail::accessor_policies::list_item> *this)

{
  handle hStack_18;
  
  if ((this->cache).super_handle.m_ptr == (PyObject *)0x0) {
    accessor_policies::list_item::get<unsigned_long,_0>
              ((list_item *)&hStack_18,(this->obj).m_ptr,&this->key);
    object::operator=(&this->cache,(object *)&hStack_18);
    handle::dec_ref(&hStack_18);
  }
  return &this->cache;
}

Assistant:

object &get_cache() const {
        if (!cache) {
            cache = Policy::get(obj, key);
        }
        return cache;
    }